

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2measures.cc
# Opt level: O0

double S2::TurnAngle(S2Point *a,S2Point *b,S2Point *c)

{
  int iVar1;
  FloatType local_60;
  Vector3_d local_58;
  Vector3_d local_40;
  FloatType local_28;
  double angle;
  S2Point *c_local;
  S2Point *b_local;
  S2Point *a_local;
  
  angle = (double)c;
  c_local = b;
  b_local = a;
  RobustCrossProd(&local_40,a,b);
  RobustCrossProd(&local_58,c_local,(S2Point *)angle);
  local_28 = Vector3<double>::Angle(&local_40,&local_58);
  iVar1 = s2pred::Sign(b_local,c_local,(S2Point *)angle);
  if (iVar1 < 1) {
    local_60 = -local_28;
  }
  else {
    local_60 = local_28;
  }
  return local_60;
}

Assistant:

double TurnAngle(const S2Point& a, const S2Point& b, const S2Point& c) {
  // We use RobustCrossProd() to get good accuracy when two points are very
  // close together, and Sign() to ensure that the sign is correct for
  // turns that are close to 180 degrees.
  //
  // Unfortunately we can't save RobustCrossProd(a, b) and pass it as the
  // optional 4th argument to Sign(), because Sign() requires a.CrossProd(b)
  // exactly (the robust version differs in magnitude).
  double angle = RobustCrossProd(a, b).Angle(RobustCrossProd(b, c));

  // Don't return Sign() * angle because it is legal to have (a == c).
  return (s2pred::Sign(a, b, c) > 0) ? angle : -angle;
}